

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O2

pool_ptr<soul::AST::Expression> __thiscall
soul::ResolutionPass::FunctionResolver::resolveFunction
          (FunctionResolver *this,PossibleFunction *f,CallOrCast *call,bool ignoreErrorsInGenerics)

{
  Function *args_1;
  bool bVar1;
  FunctionCall *pFVar2;
  undefined7 in_register_00000009;
  long lVar3;
  Identifier *extraout_RDX;
  Identifier *extraout_RDX_00;
  Identifier *args;
  undefined1 in_R8B;
  bool local_61;
  CompileMessage local_60;
  
  lVar3 = CONCAT71(in_register_00000009,ignoreErrorsInGenerics);
  bVar1 = AST::Function::isRunFunction
                    ((Function *)
                     (call->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.
                     _vptr_ASTObject);
  args = extraout_RDX;
  if (!bVar1) {
    bVar1 = AST::Function::isUserInitFunction
                      ((Function *)
                       (call->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject
                       ._vptr_ASTObject);
    args = extraout_RDX_00;
    if (!bVar1) {
      args_1 = (Function *)
               (call->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.
               _vptr_ASTObject;
      if ((args_1->genericWildcards).
          super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (args_1->genericWildcards).
          super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_61 = false;
        pFVar2 = PoolAllocator::
                 allocate<soul::AST::FunctionCall,soul::AST::Context&,soul::AST::Function&,soul::pool_ptr<soul::AST::CommaSeparatedList>&,bool>
                           (*(PoolAllocator **)&f[1].isImpossible,(Context *)(lVar3 + 0x10),args_1,
                            (pool_ptr<soul::AST::CommaSeparatedList> *)(lVar3 + 0x30),&local_61);
        (this->super_ErrorIgnoringRewritingASTVisitor).super_RewritingASTVisitor.
        _vptr_RewritingASTVisitor = (_func_int **)pFVar2;
      }
      else {
        (**(code **)&f->function[2].super_ASTObject.objectType)(this,f,lVar3,args_1,in_R8B);
      }
      return (pool_ptr<soul::AST::Expression>)(Expression *)this;
    }
  }
  Errors::cannotCallFunction<soul::Identifier&>
            (&local_60,
             (Errors *)
             ((call->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.
              _vptr_ASTObject + 7),args);
  AST::Context::throwError((Context *)(lVar3 + 0x10),&local_60,false);
}

Assistant:

pool_ptr<AST::Expression> resolveFunction (const PossibleFunction& f, AST::CallOrCast& call, bool ignoreErrorsInGenerics)
        {
            if (f.function.isRunFunction() || f.function.isUserInitFunction())
                call.context.throwError (Errors::cannotCallFunction (f.function.name));

            if (f.function.isGeneric())
                return createCallToGenericFunction (call, f.function, ignoreErrorsInGenerics);

            return allocator.allocate<AST::FunctionCall> (call.context, f.function, call.arguments, false);
        }